

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMS_CREATION_DATA_Unmarshal(TPMS_CREATION_DATA *target,BYTE **buffer,INT32 *size)

{
  int iVar1;
  UINT16 UVar2;
  TPM_RC TVar3;
  
  TVar3 = TPML_PCR_SELECTION_Unmarshal(&target->pcrSelect,buffer,size);
  if (((TVar3 == 0) && (TVar3 = TPM2B_DIGEST_Unmarshal(&target->pcrDigest,buffer,size), TVar3 == 0))
     && (TVar3 = UINT8_Unmarshal((UINT8 *)&target->locality,buffer,size), TVar3 == 0)) {
    iVar1 = *size;
    *size = iVar1 + -2;
    TVar3 = 0x9a;
    if (1 < iVar1) {
      UVar2 = ByteArrayToUint16(*buffer);
      target->parentNameAlg = UVar2;
      *buffer = *buffer + 2;
      TVar3 = TPM2B_NAME_Unmarshal(&target->parentName,buffer,size);
      if ((TVar3 == 0) &&
         (TVar3 = TPM2B_NAME_Unmarshal(&target->parentQualifiedName,buffer,size), TVar3 == 0)) {
        TVar3 = TPM2B_DATA_Unmarshal(&target->outsideInfo,buffer,size);
        return TVar3;
      }
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPMS_CREATION_DATA_Unmarshal(TPMS_CREATION_DATA *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPML_PCR_SELECTION_Unmarshal((TPML_PCR_SELECTION *)&(target->pcrSelect), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->pcrDigest), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMA_LOCALITY_Unmarshal((TPMA_LOCALITY *)&(target->locality), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM_ALG_ID_Unmarshal((TPM_ALG_ID *)&(target->parentNameAlg), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_NAME_Unmarshal((TPM2B_NAME *)&(target->parentName), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_NAME_Unmarshal((TPM2B_NAME *)&(target->parentQualifiedName), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DATA_Unmarshal((TPM2B_DATA *)&(target->outsideInfo), buffer, size);
    return result;
}